

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O2

void __thiscall
Assimp::MMDImporter::CreateDataFromImport(MMDImporter *this,PmxModel *pModel,aiScene *pScene)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int indexCount;
  size_t __n;
  PmxMaterial *pPVar4;
  PmxBone *pPVar5;
  PmxBone *pPVar6;
  uint index;
  aiNode *paVar7;
  uint *puVar8;
  ulong uVar9;
  aiMesh **ppaVar10;
  aiMesh *paVar11;
  long lVar12;
  aiMaterial **ppaVar13;
  aiMaterial *paVar14;
  uint i;
  uint indexStart;
  int iVar15;
  ulong uVar16;
  MMDImporter *pMVar17;
  long lVar18;
  long lVar19;
  int i_1;
  long lVar20;
  unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_> ppNode;
  aiNode *pNode;
  MakeLeftHandedProcess convertProcess;
  FlipWindingOrderProcess windingFlipper;
  FlipUVsProcess uvFlipper;
  
  if (pModel != (PmxModel *)0x0) {
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    __n = (pModel->model_name)._M_string_length;
    pNode = paVar7;
    if (0xfffffffffffffc00 < __n - 0x400) {
      (paVar7->mName).length = (ai_uint32)__n;
      memcpy((paVar7->mName).data,(pModel->model_name)._M_dataplus._M_p,__n);
      (paVar7->mName).data[__n] = '\0';
    }
    pScene->mRootNode = paVar7;
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    pNode = paVar7;
    aiNode::addChildren(pScene->mRootNode,1,&pNode);
    paVar7 = pNode;
    std::__cxx11::string::string((string *)&uvFlipper,(string *)&pModel->model_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&windingFlipper,"_mesh",(allocator<char> *)&ppNode);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &convertProcess,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uvFlipper,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &windingFlipper);
    uVar9 = CONCAT44(convertProcess.super_BaseProcess.shared._4_4_,
                     convertProcess.super_BaseProcess.shared._0_4_);
    if (uVar9 < 0x400) {
      (paVar7->mName).length = (ai_uint32)convertProcess.super_BaseProcess.shared._0_4_;
      memcpy((paVar7->mName).data,convertProcess.super_BaseProcess._vptr_BaseProcess,uVar9);
      (paVar7->mName).data[uVar9] = '\0';
    }
    std::__cxx11::string::~string((string *)&convertProcess);
    std::__cxx11::string::~string((string *)&windingFlipper);
    std::__cxx11::string::~string((string *)&uvFlipper);
    paVar7 = pNode;
    uVar3 = pModel->material_count;
    pNode->mNumMeshes = uVar3;
    puVar8 = (uint *)operator_new__((ulong)uVar3 << 2);
    paVar7->mMeshes = puVar8;
    for (uVar9 = 0; uVar9 < paVar7->mNumMeshes; uVar9 = uVar9 + 1) {
      paVar7->mMeshes[uVar9] = (uint)uVar9;
      paVar7 = pNode;
    }
    uVar16 = (ulong)(uint)pModel->material_count;
    pScene->mNumMeshes = pModel->material_count;
    pMVar17 = (MMDImporter *)(uVar16 << 3);
    ppaVar10 = (aiMesh **)operator_new__((ulong)pMVar17);
    pScene->mMeshes = ppaVar10;
    lVar19 = 0;
    iVar15 = 0;
    for (uVar9 = 0; uVar9 < uVar16; uVar9 = uVar9 + 1) {
      indexCount = *(int *)((long)((pModel->materials)._M_t.
                                   super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                                   .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl)->
                                  edge_color + lVar19 + 0x48U);
      paVar11 = CreateMesh(pMVar17,pModel,iVar15,indexCount);
      pScene->mMeshes[uVar9] = paVar11;
      pPVar4 = (pModel->materials)._M_t.
               super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
               super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl;
      uVar16 = *(ulong *)((long)pPVar4->diffuse + lVar19 + 0xffffffffffffffc8U);
      if (uVar16 < 0x400) {
        paVar11 = pScene->mMeshes[uVar9];
        (paVar11->mName).length = (ai_uint32)uVar16;
        pMVar17 = (MMDImporter *)(paVar11->mName).data;
        memcpy(pMVar17,*(void **)((long)pPVar4->diffuse + lVar19 + -0x40),uVar16);
        (paVar11->mName).data[uVar16] = '\0';
      }
      pScene->mMeshes[uVar9]->mMaterialIndex = (uint)uVar9;
      iVar15 = iVar15 + indexCount;
      uVar16 = (ulong)pScene->mNumMeshes;
      lVar19 = lVar19 + 0xc0;
    }
    uVar16 = (ulong)pModel->bone_count;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (long)uVar16) {
      uVar9 = uVar16 * 8;
    }
    ppNode._M_t.super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>._M_t.
    super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>.
    super__Head_base<0UL,_aiNode_**,_false>._M_head_impl =
         (__uniq_ptr_data<aiNode_*,_std::default_delete<aiNode_*[]>,_true,_true>)
         operator_new__(uVar9);
    lVar19 = 0;
    for (lVar18 = 0; lVar18 < (int)uVar16; lVar18 = lVar18 + 1) {
      paVar7 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar7,(string *)
                            ((long)((pModel->bones)._M_t.
                                    super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>
                                    .super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl)->
                                   position + lVar19 + -0x40));
      *(aiNode **)
       ((long)ppNode._M_t.super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>._M_t.
              super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>.
              super__Head_base<0UL,_aiNode_**,_false>._M_head_impl + lVar18 * 8) = paVar7;
      uVar16 = (ulong)(uint)pModel->bone_count;
      lVar19 = lVar19 + 0xb0;
    }
    lVar19 = 0x4c;
    lVar18 = 0;
    for (lVar20 = 0; lVar20 < (int)uVar16; lVar20 = lVar20 + 1) {
      pPVar5 = (pModel->bones)._M_t.
               super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
               super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
      lVar12 = (long)*(int *)((long)pPVar5->position + lVar19 + -0x40);
      if (lVar12 < 0) {
        aiNode::addChildren(pScene->mRootNode,1,
                            (aiNode **)
                            ((long)ppNode._M_t.
                                   super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>
                                   .super__Head_base<0UL,_aiNode_**,_false>._M_head_impl + lVar18));
      }
      else {
        aiNode::addChildren(*(aiNode **)
                             ((long)ppNode._M_t.
                                    super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>
                                    .super__Head_base<0UL,_aiNode_**,_false>._M_head_impl +
                             lVar12 * 8),1,
                            (aiNode **)
                            ((long)ppNode._M_t.
                                   super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>
                                   .super__Head_base<0UL,_aiNode_**,_false>._M_head_impl + lVar18));
        iVar15 = *(int *)((long)pPVar5->position + lVar19 + -0x40);
        pPVar6 = (pModel->bones)._M_t.
                 super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
                 super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
        convertProcess.super_BaseProcess.shared._0_4_ =
             *(float *)((long)pPVar5->position + lVar19 + 0xffffffffffffffbcU) -
             pPVar6[iVar15].position[2];
        uVar1 = *(undefined8 *)((long)pPVar5->position + lVar19 + 0xffffffffffffffb4U);
        uVar2 = *(undefined8 *)pPVar6[iVar15].position;
        convertProcess.super_BaseProcess._vptr_BaseProcess =
             (_func_int **)
             CONCAT44((float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20),
                      (float)uVar1 - (float)uVar2);
        aiMatrix4x4t<float>::Translation
                  ((aiVector3t<float> *)&convertProcess,
                   (aiMatrix4x4t<float> *)
                   (*(long *)((long)ppNode._M_t.
                                    super___uniq_ptr_impl<aiNode_*,_std::default_delete<aiNode_*[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_aiNode_**,_std::default_delete<aiNode_*[]>_>
                                    .super__Head_base<0UL,_aiNode_**,_false>._M_head_impl + lVar18)
                   + 0x404));
      }
      uVar16 = (ulong)(uint)pModel->bone_count;
      lVar18 = lVar18 + 8;
      lVar19 = lVar19 + 0xb0;
    }
    uVar9 = (ulong)(uint)pModel->material_count;
    pScene->mNumMaterials = pModel->material_count;
    pMVar17 = (MMDImporter *)(uVar9 << 3);
    ppaVar13 = (aiMaterial **)operator_new__((ulong)pMVar17);
    pScene->mMaterials = ppaVar13;
    lVar19 = 0;
    for (uVar16 = 0; uVar16 < uVar9; uVar16 = uVar16 + 1) {
      paVar14 = CreateMaterial(pMVar17,(PmxMaterial *)
                                       ((long)((pModel->materials)._M_t.
                                               super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                                               .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>.
                                              _M_head_impl)->diffuse + lVar19 + -0x40),pModel);
      pScene->mMaterials[uVar16] = paVar14;
      uVar9 = (ulong)pScene->mNumMaterials;
      lVar19 = lVar19 + 0xc0;
    }
    MakeLeftHandedProcess::MakeLeftHandedProcess(&convertProcess);
    MakeLeftHandedProcess::Execute(&convertProcess,pScene);
    FlipUVsProcess::FlipUVsProcess(&uvFlipper);
    FlipUVsProcess::Execute(&uvFlipper,pScene);
    FlipWindingOrderProcess::FlipWindingOrderProcess(&windingFlipper);
    FlipWindingOrderProcess::Execute(&windingFlipper,pScene);
    FlipWindingOrderProcess::~FlipWindingOrderProcess(&windingFlipper);
    FlipUVsProcess::~FlipUVsProcess(&uvFlipper);
    MakeLeftHandedProcess::~MakeLeftHandedProcess(&convertProcess);
    std::unique_ptr<aiNode_*[],_std::default_delete<aiNode_*[]>_>::~unique_ptr(&ppNode);
  }
  return;
}

Assistant:

void MMDImporter::CreateDataFromImport(const pmx::PmxModel *pModel,
                                       aiScene *pScene) {
  if (pModel == NULL) {
    return;
  }

  aiNode *pNode = new aiNode;
  if (!pModel->model_name.empty()) {
    pNode->mName.Set(pModel->model_name);
  }

  pScene->mRootNode = pNode;

  pNode = new aiNode;
  pScene->mRootNode->addChildren(1, &pNode);
  pNode->mName.Set(string(pModel->model_name) + string("_mesh"));

  // split mesh by materials
  pNode->mNumMeshes = pModel->material_count;
  pNode->mMeshes = new unsigned int[pNode->mNumMeshes];
  for (unsigned int index = 0; index < pNode->mNumMeshes; index++) {
    pNode->mMeshes[index] = index;
  }

  pScene->mNumMeshes = pModel->material_count;
  pScene->mMeshes = new aiMesh *[pScene->mNumMeshes];
  for (unsigned int i = 0, indexStart = 0; i < pScene->mNumMeshes; i++) {
    const int indexCount = pModel->materials[i].index_count;

    pScene->mMeshes[i] = CreateMesh(pModel, indexStart, indexCount);
    pScene->mMeshes[i]->mName = pModel->materials[i].material_name;
    pScene->mMeshes[i]->mMaterialIndex = i;
    indexStart += indexCount;
  }

  // create node hierarchy for bone position
  std::unique_ptr<aiNode *[]> ppNode(new aiNode *[pModel->bone_count]);
  for (auto i = 0; i < pModel->bone_count; i++) {
    ppNode[i] = new aiNode(pModel->bones[i].bone_name);
  }

  for (auto i = 0; i < pModel->bone_count; i++) {
    const pmx::PmxBone &bone = pModel->bones[i];

    if (bone.parent_index < 0) {
      pScene->mRootNode->addChildren(1, ppNode.get() + i);
    } else {
      ppNode[bone.parent_index]->addChildren(1, ppNode.get() + i);

      aiVector3D v3 = aiVector3D(
          bone.position[0] - pModel->bones[bone.parent_index].position[0],
          bone.position[1] - pModel->bones[bone.parent_index].position[1],
          bone.position[2] - pModel->bones[bone.parent_index].position[2]);
      aiMatrix4x4::Translation(v3, ppNode[i]->mTransformation);
    }
  }

  // create materials
  pScene->mNumMaterials = pModel->material_count;
  pScene->mMaterials = new aiMaterial *[pScene->mNumMaterials];
  for (unsigned int i = 0; i < pScene->mNumMaterials; i++) {
    pScene->mMaterials[i] = CreateMaterial(&pModel->materials[i], pModel);
  }

  // Convert everything to OpenGL space
  MakeLeftHandedProcess convertProcess;
  convertProcess.Execute(pScene);

  FlipUVsProcess uvFlipper;
  uvFlipper.Execute(pScene);

  FlipWindingOrderProcess windingFlipper;
  windingFlipper.Execute(pScene);
}